

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl.h
# Opt level: O2

void avl_balance_tree(avl_node_t **node)

{
  avl_node_t *node_00;
  uint uVar1;
  uint uVar2;
  int iVar3;
  avl_node_t *paVar4;
  avl_node_t *paVar5;
  uint uVar6;
  avl_node_t *child_1;
  avl_node_t *child;
  
  paVar5 = *node;
  uVar6 = 0;
  uVar1 = 0;
  paVar4 = paVar5->left;
  if (paVar4 != (avl_node_t *)0x0) {
    uVar6 = paVar4->height;
  }
  node_00 = paVar5->right;
  if (node_00 != (avl_node_t *)0x0) {
    uVar1 = node_00->height;
  }
  uVar2 = uVar1;
  if ((int)uVar1 < (int)uVar6) {
    uVar2 = uVar6;
  }
  paVar5->height = uVar2 + 1;
  if ((int)(uVar6 - uVar1) < 2) {
    if (-2 < (int)(uVar6 - uVar1)) {
      return;
    }
    iVar3 = avl_get_balance(node_00);
    if (-1 < iVar3) {
      paVar4 = avl_rotate_LL(node_00);
      paVar5->right = paVar4;
    }
    paVar5 = avl_rotate_RR(paVar5);
  }
  else {
    iVar3 = avl_get_balance(paVar4);
    if (iVar3 < 1) {
      paVar4 = avl_rotate_RR(paVar4);
      paVar5->left = paVar4;
    }
    paVar5 = avl_rotate_LL(paVar5);
  }
  *node = paVar5;
  return;
}

Assistant:

static void
avl_balance_tree(avl_node_t **node)
{
    int factor = avl_update_height_get_balance(*node);

    if (factor > 1) {
        if (avl_get_balance((*node)->left) > 0) *node = avl_rotate_LL(*node);
        else *node = avl_rotate_LR(*node);
    } else if (factor < -1) {
        if (avl_get_balance((*node)->right) < 0) *node = avl_rotate_RR(*node);
        else *node = avl_rotate_RL(*node);
    }
}